

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

void Gia_ManHashProfile(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_30;
  uint local_20;
  int Limit;
  int Counter;
  int i;
  Gia_Obj_t *pEntry;
  Gia_Man_t *p_local;
  
  uVar1 = p->nHTable;
  uVar2 = Gia_ManAndNum(p);
  printf("Table size = %d. Entries = %d. ",(ulong)uVar1,(ulong)uVar2);
  printf("Hits = %d. Misses = %d.\n",p->nHashHit & 0xffffffff,p->nHashMiss & 0xffffffff);
  iVar3 = Abc_MinInt(1000,p->nHTable);
  for (Limit = 0; Limit < iVar3; Limit = Limit + 1) {
    local_20 = 0;
    if (p->pHTable[Limit] == 0) {
      local_30 = (Gia_Obj_t *)0x0;
    }
    else {
      iVar4 = Abc_Lit2Var(p->pHTable[Limit]);
      local_30 = Gia_ManObj(p,iVar4);
    }
    _Counter = local_30;
    while (_Counter != (Gia_Obj_t *)0x0) {
      local_20 = local_20 + 1;
      if (_Counter->Value == 0) {
        local_40 = (Gia_Obj_t *)0x0;
      }
      else {
        iVar4 = Abc_Lit2Var(_Counter->Value);
        local_40 = Gia_ManObj(p,iVar4);
      }
      _Counter = local_40;
    }
    if (local_20 != 0) {
      printf("%d ",(ulong)local_20);
    }
  }
  printf("\n");
  return;
}

Assistant:

void Gia_ManHashProfile( Gia_Man_t * p )
{
    Gia_Obj_t * pEntry;
    int i, Counter, Limit;
    printf( "Table size = %d. Entries = %d. ", p->nHTable, Gia_ManAndNum(p) );
    printf( "Hits = %d. Misses = %d.\n", (int)p->nHashHit, (int)p->nHashMiss );
    Limit = Abc_MinInt( 1000, p->nHTable );
    for ( i = 0; i < Limit; i++ )
    {
        Counter = 0;
        for ( pEntry = (p->pHTable[i]? Gia_ManObj(p, Abc_Lit2Var(p->pHTable[i])) : NULL); 
              pEntry; 
              pEntry = (pEntry->Value? Gia_ManObj(p, Abc_Lit2Var(pEntry->Value)) : NULL) )
            Counter++;
        if ( Counter ) 
            printf( "%d ", Counter );
    }
    printf( "\n" );
}